

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::alertMessageReceived(TlsCryptographOpenSSL *this,int value)

{
  long lVar1;
  undefined8 uVar2;
  AlertLevel AVar3;
  AlertType AVar4;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined8 *)(in_RDI + 0x10);
  AVar3 = anon_unknown.dwarf_10d188::tlsAlertLevel(in_stack_ffffffffffffffc0);
  AVar4 = anon_unknown.dwarf_10d188::tlsAlertType(in_ESI);
  anon_unknown.dwarf_10d188::tlsAlertDescription(in_ESI);
  QSslSocket::alertReceived((AlertLevel)uVar2,AVar3,(QString *)(ulong)AVar4);
  QString::~QString((QString *)0x150669);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::alertMessageReceived(int value)
{
    Q_ASSERT(q);

    emit q->alertReceived(tlsAlertLevel(value), tlsAlertType(value), tlsAlertDescription(value));
}